

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

BOOL Js::JavascriptArray::GetParamForIndexOf<unsigned_int>
               (uint length,Arguments *args,Var *search,uint *fromIndex,ScriptContext *scriptContext
               )

{
  uint uVar1;
  Var pvVar2;
  JavascriptLibrary *this;
  RecyclableObject *local_38;
  ScriptContext *scriptContext_local;
  uint *fromIndex_local;
  Var *search_local;
  Arguments *args_local;
  uint length_local;
  
  if (length == 0) {
    args_local._4_4_ = 0;
  }
  else {
    if ((SUB84(args->Info,0) & 0xffffff) < 3) {
      *fromIndex = 0;
      if ((SUB84(args->Info,0) & 0xffffff) == 1 || ((ulong)args->Info & 0xffffff) == 0) {
        this = ScriptContext::GetLibrary(scriptContext);
        local_38 = JavascriptLibraryBase::GetUndefined(&this->super_JavascriptLibraryBase);
      }
      else {
        local_38 = (RecyclableObject *)Arguments::operator[](args,1);
      }
      *search = local_38;
    }
    else {
      pvVar2 = Arguments::operator[](args,2);
      uVar1 = GetFromIndex<unsigned_int>(pvVar2,length,scriptContext,true);
      *fromIndex = uVar1;
      if (length <= *fromIndex) {
        return 0;
      }
      pvVar2 = Arguments::operator[](args,1);
      *search = pvVar2;
    }
    args_local._4_4_ = 1;
  }
  return args_local._4_4_;
}

Assistant:

BOOL JavascriptArray::GetParamForIndexOf(T length, Arguments const& args, Var& search, T& fromIndex, ScriptContext * scriptContext)
    {
        if (length == 0)
        {
            return false;
        }

        if (args.Info.Count > 2)
        {
            fromIndex = GetFromIndex(args[2], length, scriptContext);
            if (fromIndex >= length)
            {
                return false;
            }
            search = args[1];
        }
        else
        {
            fromIndex = 0;
            search = args.Info.Count > 1 ? args[1] : scriptContext->GetLibrary()->GetUndefined();
        }
        return true;
    }